

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::execute
          (DuplicateColsPS *this,VectorBase<double> *x,VectorBase<double> *param_2,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  VarStatus *pVVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  VarStatus VVar10;
  long lVar11;
  undefined8 *puVar12;
  pointer pdVar13;
  long lVar14;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar15;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double local_d8;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  ulong uStack_30;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    lVar11 = (long)(this->m_perm).thesize;
    if (lVar11 < 1) {
      return;
    }
    piVar3 = (this->m_perm).data;
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar4 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar5 = cStatus->data;
    lVar11 = lVar11 + 1;
    do {
      lVar14 = (long)piVar3[lVar11 + -2];
      if (-1 < lVar14) {
        pdVar13[lVar11 + -2] = pdVar13[lVar14];
        pdVar4[lVar11 + -2] = pdVar4[lVar14];
        pVVar5[lVar11 + -2] = pVVar5[lVar14];
      }
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
    return;
  }
  iVar2 = this->m_k;
  pVVar5 = cStatus->data;
  switch(pVVar5[iVar2]) {
  case ON_UPPER:
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13[iVar2] = this->m_upK;
    lVar11 = (long)this->m_j;
    if (this->m_scale <= 0.0) {
LAB_001ffd05:
      pdVar13[lVar11] = this->m_loJ;
      pVVar5[lVar11] = (this->m_upJ == this->m_loJ) + ON_LOWER;
      break;
    }
    goto LAB_00200567;
  case ON_LOWER:
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13[iVar2] = this->m_loK;
    lVar11 = (long)this->m_j;
    if (0.0 < this->m_scale) goto LAB_001ffd05;
LAB_00200567:
    pdVar13[lVar11] = this->m_upJ;
    pVVar5[lVar11] = (-(uint)(this->m_upJ == this->m_loJ) & 1) * 2;
    break;
  case FIXED:
    iVar2 = this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar2] = this->m_loJ;
    pVVar5[iVar2] = FIXED;
    break;
  case ZERO:
    dVar15 = this->m_loK;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if ((extraout_XMM0_Qa_07 < ABS(dVar15)) ||
       (dVar15 = this->m_upK, (*(this->super_PostStep)._vptr_PostStep[7])(this),
       extraout_XMM0_Qa_08 < ABS(dVar15))) {
LAB_002003bf:
      dVar15 = this->m_loK;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      VVar10 = ON_LOWER;
      if (extraout_XMM0_Qa_09 < ABS(dVar15)) {
        dVar15 = this->m_upK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        VVar10 = ON_UPPER;
        if (extraout_XMM0_Qa_10 < ABS(dVar15)) {
          dVar15 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (extraout_XMM0_Qa_11 < dVar15 / dVar19) {
LAB_00200ba1:
            puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_88 = local_78;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"XMAISM05 This should never happen.","");
            *puVar12 = &PTR__SPxException_006a9ee8;
            puVar12[1] = puVar12 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar12 + 1),local_88,local_88 + local_80);
            *puVar12 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          dVar15 = this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          VVar10 = ZERO;
          if (dVar15 / dVar19 <= -extraout_XMM0_Qa_12) goto LAB_00200ba1;
        }
      }
    }
    else {
      VVar10 = FIXED;
      if ((this->m_loK != this->m_upK) || (NAN(this->m_loK) || NAN(this->m_upK))) goto LAB_002003bf;
    }
    cStatus->data[this->m_k] = VVar10;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[this->m_j] = 0.0;
    dVar15 = this->m_loJ;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if ((ABS(dVar15) <= extraout_XMM0_Qa_13) &&
       (dVar15 = this->m_upJ, (*(this->super_PostStep)._vptr_PostStep[7])(this),
       ABS(dVar15) <= extraout_XMM0_Qa_14)) {
      if ((this->m_loJ == this->m_upJ) && (!NAN(this->m_loJ) && !NAN(this->m_upJ))) {
        cStatus->data[this->m_j] = FIXED;
        break;
      }
    }
    dVar15 = this->m_loJ;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(dVar15) <= extraout_XMM0_Qa_15) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      dVar15 = this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      if (extraout_XMM0_Qa_16 < ABS(dVar15)) {
        dVar15 = this->m_loJ;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        if (dVar19 <= 0.0) {
          dVar19 = 0.0;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (dVar15 / dVar19 <= extraout_XMM0_Qa_17) {
          dVar15 = this->m_upJ;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          if (dVar19 <= 0.0) {
            dVar19 = 0.0;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (-extraout_XMM0_Qa_18 < dVar15 / dVar19) {
            cStatus->data[this->m_j] = ZERO;
            break;
          }
        }
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"XMAISM06 This should never happen.","");
        *puVar12 = &PTR__SPxException_006a9ee8;
        puVar12[1] = puVar12 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar12 + 1),local_88,local_88 + local_80);
        *puVar12 = &PTR__SPxException_006a9ec0;
        __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    break;
  case BASIC:
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar15 = pdVar13[iVar2];
    dVar19 = this->m_loK;
    dVar20 = this->m_upK;
    auVar16._0_8_ = ABS(dVar15);
    auVar16._8_8_ = ABS(dVar15);
    auVar17._8_8_ = ABS(dVar20);
    auVar17._0_8_ = ABS(dVar19);
    auVar17 = maxpd(auVar16,auVar17);
    auVar22._8_8_ = -(ulong)(auVar17._8_8_ < 1.0);
    auVar22._0_8_ = -(ulong)(auVar17._0_8_ < 1.0);
    uVar9 = movmskpd((int)pdVar13,auVar22);
    local_d8 = 1.0;
    local_68 = ZEXT816(0x3ff0000000000000);
    if ((uVar9 & 1) == 0) {
      local_68 = auVar17;
    }
    if ((uVar9 & 2) == 0) {
      local_d8 = auVar17._8_8_;
    }
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    local_38 = extraout_XMM0_Qa;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    dVar23 = this->m_loJ;
    local_48 = extraout_XMM0_Qa_00;
    ::soplex::infinity::__tls_init();
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    local_58 = -dVar1;
    uStack_50 = 0x8000000000000000;
    if ((((dVar23 <= local_58) &&
         (dVar23 = this->m_upJ, ::soplex::infinity::__tls_init(), dVar1 <= dVar23)) &&
        (dVar23 = this->m_loK, ::soplex::infinity::__tls_init(), dVar23 <= local_58)) &&
       (dVar23 = this->m_upK, ::soplex::infinity::__tls_init(), dVar1 <= dVar23)) {
      iVar2 = this->m_j;
      cStatus->data[iVar2] = ZERO;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar2] = 0.0;
      break;
    }
    auVar18._8_8_ = dVar19;
    auVar18._0_8_ = dVar15;
    auVar7._8_8_ = local_68._0_8_;
    auVar7._0_8_ = local_68._0_8_;
    auVar17 = divpd(auVar18,auVar7);
    auVar21._8_8_ = dVar20;
    auVar21._0_8_ = dVar15;
    auVar8._8_8_ = local_d8;
    auVar8._0_8_ = local_d8;
    auVar22 = divpd(auVar21,auVar8);
    dVar19 = auVar17._8_8_;
    dVar23 = auVar22._8_8_;
    dVar15 = auVar17._0_8_ - dVar19;
    dVar20 = auVar22._0_8_ - dVar23;
    bVar6 = ABS(dVar20) <= local_48;
    local_48 = (double)(~-(ulong)(ABS(dVar15) <= local_38) & (ulong)dVar15);
    uStack_40 = ~(ulong)ABS(dVar19) & (ulong)dVar19;
    local_38 = (double)(~-(ulong)bVar6 & (ulong)dVar20);
    uStack_30 = ~(ulong)ABS(dVar23) & (ulong)dVar23;
    dVar15 = this->m_scale;
    dVar19 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_k];
    if (dVar15 <= 0.0) {
      dVar20 = this->m_upK + dVar15 * this->m_loJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar23 = ABS(dVar20);
      dVar15 = ABS(dVar19);
      if (ABS(dVar19) <= dVar23) {
        dVar15 = dVar23;
      }
      if (dVar15 <= 1.0) {
        dVar15 = 1.0;
      }
      if ((dVar19 - dVar20) / dVar15 <= -extraout_XMM0_Qa_19) {
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar20 = this->m_scale * this->m_loJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar20);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (((dVar15 - dVar20) / dVar19 <= -extraout_XMM0_Qa_20) ||
           (dVar15 = this->m_loJ, ::soplex::infinity::__tls_init(), dVar15 <= local_58)) {
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar20 = this->m_scale * this->m_upJ + this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar20);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if ((-extraout_XMM0_Qa_21 < (dVar15 - dVar20) / dVar19) &&
             (dVar15 = this->m_upK, ::soplex::infinity::__tls_init(), dVar15 < dVar1))
          goto LAB_00200891;
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar20 = this->m_scale * this->m_upJ + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar20);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (((dVar15 - dVar20) / dVar19 <= -extraout_XMM0_Qa_22) ||
             (dVar15 = this->m_upJ, ::soplex::infinity::__tls_init(), dVar1 <= dVar15)) {
            dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
            dVar20 = this->m_scale * this->m_upJ + this->m_loK;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar19 = ABS(dVar15);
            dVar23 = ABS(dVar20);
            if (dVar19 <= dVar23) {
              dVar19 = dVar23;
            }
            if (dVar19 <= 1.0) {
              dVar19 = 1.0;
            }
            if (-extraout_XMM0_Qa_23 < (dVar15 - dVar20) / dVar19) {
              dVar15 = this->m_loK;
              ::soplex::infinity::__tls_init();
              if (local_58 < dVar15) goto LAB_00200a40;
            }
            local_68._8_8_ = 0;
            local_68._0_8_ =
                 (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
            dVar19 = this->m_scale * this->m_upJ + this->m_loK;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar20 = ABS(dVar19);
            dVar15 = ABS((double)local_68._0_8_);
            if (ABS((double)local_68._0_8_) <= dVar20) {
              dVar15 = dVar20;
            }
            if (dVar15 <= 1.0) {
              dVar15 = 1.0;
            }
            if (-extraout_XMM0_Qa_24 < ((double)local_68._0_8_ - dVar19) / dVar15) {
              puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_88 = local_78;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"XMAISM09 This should never happen.","");
              *puVar12 = &PTR__SPxException_006a9ee8;
              puVar12[1] = puVar12 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar12 + 1),local_88,local_88 + local_80);
              *puVar12 = &PTR__SPxException_006a9ec0;
              __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
            }
          }
          goto LAB_00200b12;
        }
      }
LAB_002006e4:
      dVar15 = this->m_loJ;
      iVar2 = this->m_j;
      cStatus->data[iVar2] = (this->m_upJ == dVar15) + ON_LOWER;
      pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13[iVar2] = dVar15;
      pdVar13[this->m_k] = pdVar13[this->m_k] - dVar15 * this->m_scale;
    }
    else {
      dVar20 = this->m_upK + dVar15 * this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar23 = ABS(dVar20);
      dVar15 = ABS(dVar19);
      if (ABS(dVar19) <= dVar23) {
        dVar15 = dVar23;
      }
      if (dVar15 <= 1.0) {
        dVar15 = 1.0;
      }
      if ((dVar19 - dVar20) / dVar15 <= -extraout_XMM0_Qa_01) {
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        dVar20 = this->m_scale * this->m_upJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar19 = ABS(dVar15);
        dVar23 = ABS(dVar20);
        if (dVar19 <= dVar23) {
          dVar19 = dVar23;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (((dVar15 - dVar20) / dVar19 <= -extraout_XMM0_Qa_02) ||
           (dVar15 = this->m_upJ, ::soplex::infinity::__tls_init(), dVar1 <= dVar15)) {
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar20 = this->m_scale * this->m_loJ + this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar20);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if ((-extraout_XMM0_Qa_03 < (dVar15 - dVar20) / dVar19) &&
             (dVar15 = this->m_upK, ::soplex::infinity::__tls_init(), dVar15 < dVar1)) {
LAB_00200891:
            dVar15 = this->m_upK;
            iVar2 = this->m_k;
            pVVar5 = cStatus->data;
            pVVar5[iVar2] = (-(uint)(this->m_loK == dVar15) & 1) * 2;
            pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar13[iVar2] = dVar15;
            iVar2 = this->m_j;
            pVVar5[iVar2] = BASIC;
            pdVar13[iVar2] = (local_d8 * local_38) / this->m_scale;
            break;
          }
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          dVar20 = this->m_scale * this->m_loJ + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar19 = ABS(dVar15);
          dVar23 = ABS(dVar20);
          if (dVar19 <= dVar23) {
            dVar19 = dVar23;
          }
          if (dVar19 <= 1.0) {
            dVar19 = 1.0;
          }
          if (((dVar15 - dVar20) / dVar19 <= -extraout_XMM0_Qa_04) ||
             (dVar15 = this->m_loJ, ::soplex::infinity::__tls_init(), dVar15 <= local_58)) {
            dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
            dVar20 = this->m_scale * this->m_loJ + this->m_loK;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar19 = ABS(dVar15);
            dVar23 = ABS(dVar20);
            if (dVar19 <= dVar23) {
              dVar19 = dVar23;
            }
            if (dVar19 <= 1.0) {
              dVar19 = 1.0;
            }
            if (-extraout_XMM0_Qa_05 < (dVar15 - dVar20) / dVar19) {
              dVar15 = this->m_loK;
              ::soplex::infinity::__tls_init();
              if (local_58 < dVar15) {
LAB_00200a40:
                dVar15 = this->m_loK;
                iVar2 = this->m_k;
                pVVar5 = cStatus->data;
                pVVar5[iVar2] = (this->m_upK == dVar15) + ON_LOWER;
                pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar13[iVar2] = dVar15;
                iVar2 = this->m_j;
                pVVar5[iVar2] = BASIC;
                pdVar13[iVar2] = ((double)local_68._0_8_ * local_48) / this->m_scale;
                break;
              }
            }
            local_68._8_8_ = 0;
            local_68._0_8_ =
                 (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
            dVar19 = this->m_scale * this->m_loJ + this->m_loK;
            (*(this->super_PostStep)._vptr_PostStep[7])(this);
            dVar20 = ABS(dVar19);
            dVar15 = ABS((double)local_68._0_8_);
            if (ABS((double)local_68._0_8_) <= dVar20) {
              dVar15 = dVar20;
            }
            if (dVar15 <= 1.0) {
              dVar15 = 1.0;
            }
            if (-extraout_XMM0_Qa_06 < ((double)local_68._0_8_ - dVar19) / dVar15) {
              puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_88 = local_78;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"XMAISM08 This should never happen.","");
              *puVar12 = &PTR__SPxException_006a9ee8;
              puVar12[1] = puVar12 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar12 + 1),local_88,local_88 + local_80);
              *puVar12 = &PTR__SPxException_006a9ec0;
              __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
            }
          }
          goto LAB_002006e4;
        }
      }
LAB_00200b12:
      dVar15 = this->m_upJ;
      iVar2 = this->m_j;
      cStatus->data[iVar2] = (-(uint)(this->m_loJ == dVar15) & 1) * 2;
      pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13[iVar2] = dVar15;
      pdVar13[this->m_k] = pdVar13[this->m_k] - dVar15 * this->m_scale;
    }
  }
  pdVar13 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13[this->m_j] = this->m_scale * pdVar13[this->m_k];
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}